

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreParsingUtils.h
# Opt level: O2

bool Assimp::Ogre::EndsWith(string *s,string *suffix,bool caseSensitive)

{
  int iVar1;
  string *this;
  bool bVar2;
  string sSuffix;
  string local_70;
  string local_50;
  string local_30;
  
  if ((s->_M_string_length == 0) || (s->_M_string_length <= suffix->_M_string_length - 1)) {
    bVar2 = false;
  }
  else {
    if (caseSensitive) {
      std::__cxx11::string::substr((ulong)&sSuffix,(ulong)s);
      iVar1 = ASSIMP_stricmp(&sSuffix,suffix);
      bVar2 = iVar1 == 0;
      this = &sSuffix;
    }
    else {
      std::__cxx11::string::string((string *)&local_30,(string *)s);
      ToLower(&sSuffix,&local_30);
      std::__cxx11::string::string((string *)&local_70,(string *)suffix);
      ToLower(&local_50,&local_70);
      bVar2 = EndsWith(&sSuffix,&local_50,true);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&sSuffix);
      this = &local_30;
    }
    std::__cxx11::string::~string((string *)this);
  }
  return bVar2;
}

Assistant:

static AI_FORCE_INLINE
bool EndsWith(const std::string &s, const std::string &suffix, bool caseSensitive = true) {
    if (s.empty() || suffix.empty()) {
        return false;
    } else if (s.length() < suffix.length()) {
        return false;
    }

    if (!caseSensitive) {
        return EndsWith(ToLower(s), ToLower(suffix), true);
    }

    size_t len = suffix.length();
    std::string sSuffix = s.substr(s.length()-len, len);

    return (ASSIMP_stricmp(sSuffix, suffix) == 0);
}